

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# large.c
# Opt level: O3

void * duckdb_je_large_palloc(tsdn_t *tsdn,arena_t *arena,size_t usize,size_t alignment,_Bool zero)

{
  tcache_slow_t *tcache_slow;
  tcache_t *tcache;
  pthread_mutex_t *__mutex;
  uint64_t *puVar1;
  witness_t **ppwVar2;
  char cVar3;
  arena_t *paVar4;
  edata_t *peVar5;
  long lVar6;
  int iVar7;
  edata_t *peVar8;
  edata_t *peVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  
  if (alignment < 0x1001 && usize < 0x3801) {
    uVar11 = -alignment & (usize + alignment) - 1;
    if (uVar11 < 0x1001) {
      sVar12 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar11 + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < uVar11) {
        return (void *)0x0;
      }
      uVar10 = uVar11 * 2 - 1;
      lVar6 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar6 == 0; lVar6 = lVar6 + -1) {
        }
      }
      uVar10 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
      sVar12 = ~uVar10 + uVar11 & uVar10;
    }
    uVar11 = 0x4000;
    if (0x3fff < sVar12) goto LAB_00cded9e;
  }
  else {
    if (0x7000000000000000 < alignment) {
      return (void *)0x0;
    }
    uVar11 = 0x4000;
    if (0x4000 < usize) {
      if (usize < 0x7000000000000001) {
        uVar11 = usize * 2 - 1;
        lVar6 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        uVar11 = -1L << (0x3c - ((byte)lVar6 ^ 0x3f) & 0x3f);
        uVar11 = ~uVar11 + usize & uVar11;
      }
      else {
        uVar11 = 0;
      }
      if (uVar11 < usize) {
        return (void *)0x0;
      }
    }
LAB_00cded9e:
    sVar12 = 0;
    if (uVar11 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar11) -
                  0x1000) {
      sVar12 = uVar11;
    }
  }
  if (sVar12 + 0x8fffffffffffffff < 0x9000000000000000) {
    return (void *)0x0;
  }
  if (tsdn != (tsdn_t *)0x0) {
    if (arena != (arena_t *)0x0) goto LAB_00cdee67;
    arena = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena;
    if (arena == (arena_t *)0x0) {
      if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level <
          '\x01') {
        arena = duckdb_je_arena_choose_hard(&tsdn->tsd,false);
        if ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled == true
           ) {
          tcache_slow = &(tsdn->tsd).
                         cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow;
          tcache = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
          paVar4 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_slow.
                   arena;
          if (paVar4 == (arena_t *)0x0) {
            duckdb_je_tcache_arena_associate(tsdn,tcache_slow,tcache,arena);
          }
          else if (paVar4 != arena) {
            duckdb_je_tcache_arena_reassociate(tsdn,tcache_slow,tcache,arena);
          }
        }
      }
      else {
        arena = (arena_t *)duckdb_je_arenas[0].repr;
        if (duckdb_je_arenas[0].repr == (void *)0x0) {
          arena = duckdb_je_arena_init(tsdn,0,&duckdb_je_arena_config_default);
        }
      }
    }
    if ((usize < (arena->pa_shard).pac.duckdb_je_oversize_threshold.repr) ||
       (duckdb_je_manual_arena_base <= arena->ind)) goto LAB_00cdee67;
    arena = duckdb_je_arena_choose_huge(&tsdn->tsd);
  }
  if (arena == (arena_t *)0x0) {
    return (void *)0x0;
  }
LAB_00cdee67:
  peVar8 = duckdb_je_arena_extent_alloc_large(tsdn,arena,usize,alignment,zero);
  if (peVar8 == (edata_t *)0x0) {
    return (void *)0x0;
  }
  if (duckdb_je_manual_arena_base <= arena->ind) {
    __mutex = (pthread_mutex_t *)((long)&(arena->large_mtx).field_0 + 0x48);
    iVar7 = pthread_mutex_trylock(__mutex);
    if (iVar7 != 0) {
      duckdb_je_malloc_mutex_lock_slow(&arena->large_mtx);
      (arena->large_mtx).field_0.field_0.locked.repr = true;
    }
    puVar1 = &(arena->large_mtx).field_0.field_0.prof_data.n_lock_ops;
    *puVar1 = *puVar1 + 1;
    if ((arena->large_mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
      (arena->large_mtx).field_0.field_0.prof_data.prev_owner = tsdn;
      ppwVar2 = &(arena->large_mtx).field_0.witness.link.qre_prev;
      *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
    }
    (peVar8->field_5).ql_link_active.qre_next = peVar8;
    (peVar8->field_5).ql_link_active.qre_prev = peVar8;
    peVar5 = (arena->large).head.qlh_first;
    peVar9 = peVar8;
    if (peVar5 != (edata_t *)0x0) {
      (peVar8->field_5).ql_link_active.qre_next = (peVar5->field_5).ql_link_active.qre_prev;
      (((arena->large).head.qlh_first)->field_5).ql_link_active.qre_prev = peVar8;
      (peVar8->field_5).ql_link_active.qre_prev =
           (((peVar8->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next;
      peVar5 = (arena->large).head.qlh_first;
      (((peVar5->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar5;
      (((peVar8->field_5).ql_link_active.qre_prev)->field_5).ql_link_active.qre_next = peVar8;
      peVar9 = (peVar8->field_5).ql_link_active.qre_next;
    }
    (arena->large).head.qlh_first = peVar9;
    (arena->large_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(__mutex);
  }
  if (tsdn != (tsdn_t *)0x0) {
    cVar3 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
    iVar7 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.
            tick;
    (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
         iVar7 + -1;
    if (iVar7 < 1) {
      if (cVar3 < '\x01') {
        uVar11 = (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state *
                 0x5851f42d4c957f2d + 0x14057b7ef767814f;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state = uVar11;
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             (int32_t)(((ulong)duckdb_je_ticker_geom_table[uVar11 >> 0x3a] *
                       (long)(tsdn->tsd).
                             cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker
                             .nticks) / 0x3d);
        duckdb_je_arena_decay(tsdn,arena,false,false);
      }
      else {
        (tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker.tick =
             0;
      }
    }
  }
  return peVar8->e_addr;
}

Assistant:

void *
large_palloc(tsdn_t *tsdn, arena_t *arena, size_t usize, size_t alignment,
    bool zero) {
	size_t ausize;
	edata_t *edata;
	UNUSED bool idump JEMALLOC_CC_SILENCE_INIT(false);

	assert(!tsdn_null(tsdn) || arena != NULL);

	ausize = sz_sa2u(usize, alignment);
	if (unlikely(ausize == 0 || ausize > SC_LARGE_MAXCLASS)) {
		return NULL;
	}

	if (likely(!tsdn_null(tsdn))) {
		arena = arena_choose_maybe_huge(tsdn_tsd(tsdn), arena, usize);
	}
	if (unlikely(arena == NULL) || (edata = arena_extent_alloc_large(tsdn,
	    arena, usize, alignment, zero)) == NULL) {
		return NULL;
	}

	/* See comments in arena_bin_slabs_full_insert(). */
	if (!arena_is_auto(arena)) {
		/* Insert edata into large. */
		malloc_mutex_lock(tsdn, &arena->large_mtx);
		edata_list_active_append(&arena->large, edata);
		malloc_mutex_unlock(tsdn, &arena->large_mtx);
	}

	arena_decay_tick(tsdn, arena);
	return edata_addr_get(edata);
}